

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

NodeArray __thiscall
anon_unknown.dwarf_2e03bb::Db::popTrailingNodeArray(Db *this,size_t FromPosition)

{
  Node **ppNVar1;
  Node **ppNVar2;
  size_t __n;
  NodeArray NVar3;
  
  ppNVar1 = (this->Names).First;
  ppNVar2 = (this->Names).Last;
  if ((ulong)((long)ppNVar2 - (long)ppNVar1 >> 3) < FromPosition) {
    __assert_fail("FromPosition <= Names.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x7d5,"NodeArray (anonymous namespace)::Db::popTrailingNodeArray(size_t)");
  }
  ppNVar1 = ppNVar1 + FromPosition;
  NVar3.Elements =
       (Node **)BumpPointerAllocator::allocate(&this->ASTAllocator,(long)ppNVar2 - (long)ppNVar1);
  __n = (long)ppNVar2 - (long)ppNVar1;
  if (__n != 0) {
    memmove(NVar3.Elements,ppNVar1,__n);
  }
  ppNVar1 = (this->Names).First;
  if (FromPosition <= (ulong)((long)(this->Names).Last - (long)ppNVar1 >> 3)) {
    (this->Names).Last = ppNVar1 + FromPosition;
    NVar3.NumElements = (long)__n >> 3;
    return NVar3;
  }
  __assert_fail("Index <= size() && \"dropBack() can\'t expand!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                ,0x780,
                "void (anonymous namespace)::PODSmallVector<(anonymous namespace)::Node *, 32>::dropBack(size_t) [T = (anonymous namespace)::Node *, N = 32]"
               );
}

Assistant:

size_t size() const { return static_cast<size_t>(Last - First); }